

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::ImageInfiniteLight::PDF_Le(ImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  Float FVar1;
  undefined1 extraout_var [56];
  Vector3<float> VVar3;
  Vector3f d;
  Tuple2<pbrt::Point2,_float> local_28;
  undefined1 auVar2 [64];
  
  VVar3 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  d.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       VVar3.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  d.super_Tuple3<pbrt::Vector3,_float>.z = -VVar3.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = EqualAreaSphereToSquare(d);
  auVar2._8_56_ = extraout_var;
  local_28 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2._0_16_);
  FVar1 = PiecewiseConstant2D::PDF(&this->distribution,(Point2f *)&local_28);
  *pdfDir = FVar1 / 12.566371;
  *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
  return;
}

Assistant:

void ImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Vector3f wl = -renderFromLight.ApplyInverse(ray.d);
    Float mapPDF = distribution.PDF(EqualAreaSphereToSquare(wl));
    *pdfDir = mapPDF / (4 * Pi);
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
}